

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode * ImGui::DockNodeTreeFindFallbackLeafNode(ImGuiDockNode *node)

{
  bool bVar1;
  ImGuiDockNode *leaf_node_1;
  ImGuiDockNode *leaf_node;
  ImGuiDockNode *node_local;
  
  bVar1 = ImGuiDockNode::IsLeafNode(node);
  node_local = node;
  if (((!bVar1) &&
      (node_local = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[0]),
      node_local == (ImGuiDockNode *)0x0)) &&
     (node_local = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[1]),
     node_local == (ImGuiDockNode *)0x0)) {
    node_local = (ImGuiDockNode *)0x0;
  }
  return node_local;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindFallbackLeafNode(ImGuiDockNode* node)
{
    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* leaf_node = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[0]))
        return leaf_node;
    if (ImGuiDockNode* leaf_node = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[1]))
        return leaf_node;
    return NULL;
}